

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O3

void cuddSetInteract(DdManager *table,int x,int y)

{
  int iVar1;
  
  iVar1 = y + (((table->size * 2 - x) + -3) * x >> 1) + -1;
  table->interact[iVar1 >> 6] = table->interact[iVar1 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  return;
}

Assistant:

void
cuddSetInteract(
  DdManager * table,
  int  x,
  int  y)
{
    int posn, word, bit;

#ifdef DD_DEBUG
    assert(x < y);
    assert(y < table->size);
    assert(x >= 0);
#endif

    posn = ((((table->size << 1) - x - 3) * x) >> 1) + y - 1;
    word = posn >> LOGBPL;
    bit = posn & (BPL-1);
    table->interact[word] |= 1L << bit;

}